

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

DynamicType * __thiscall
Js::JavascriptLibrary::CreateFunctionWithLengthAndPrototypeType
          (JavascriptLibrary *this,DynamicObject *prototype,FunctionInfo *functionInfo)

{
  ScriptContext *scriptContext;
  bool bVar1;
  undefined4 *puVar2;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *typeHandler;
  DynamicType *pDVar3;
  ScriptContext *scriptContext_00;
  code *pcVar4;
  
  if ((functionInfo->functionBodyImpl).ptr != (FunctionProxy *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar2 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar2 = 1;
    bVar1 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x51d,"(!functionInfo->HasBody())","!functionInfo->HasBody()");
    if (!bVar1) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar2 = 0;
  }
  scriptContext = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (this->inProfileMode == false) {
    pcVar4 = FunctionInfo::GetOriginalEntryPoint(functionInfo);
    scriptContext_00 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  }
  else {
    pcVar4 = ScriptContext::DebugProfileProbeThunk;
    scriptContext_00 = scriptContext;
  }
  typeHandler = SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
                New(scriptContext_00,
                    (SimplePropertyDescriptor *)&FunctionWithLengthAndPrototypeTypeDescriptors,2,0,0
                    ,false,false);
  pDVar3 = DynamicType::New(scriptContext,TypeIds_Function,&prototype->super_RecyclableObject,pcVar4
                            ,&typeHandler->super_DynamicTypeHandler,false,false);
  return pDVar3;
}

Assistant:

DynamicType * JavascriptLibrary::CreateFunctionWithLengthAndPrototypeType(DynamicObject * prototype, FunctionInfo * functionInfo)
    {
        Assert(!functionInfo->HasBody());
        return DynamicType::New(scriptContext, TypeIds_Function, prototype,
            this->inProfileMode? ProfileEntryThunk : functionInfo->GetOriginalEntryPoint(),
            SimpleDictionaryTypeHandler::New(scriptContext, FunctionWithLengthAndPrototypeTypeDescriptors, _countof(FunctionWithLengthAndPrototypeTypeDescriptors), 0, 0));
    }